

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agent_proxy_base.hpp
# Opt level: O0

bool __thiscall
ranger::bhvr_tree::detail::
agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::expired_then_update
          (agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
           *this,decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                 *key,duration *dur)

{
  bool bVar1;
  pointer ppVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*const,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>,_bool>
  pVar3;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  _Base_ptr local_70;
  undefined1 local_68;
  _Base_ptr local_50;
  undefined1 local_48;
  _Rb_tree_iterator<std::pair<const_ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*const,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  local_40;
  _Rb_tree_iterator<std::pair<const_ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*const,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
  it;
  lock_guard<ranger::bhvr_tree::dummy_mutex> lock;
  time_point now;
  duration *dur_local;
  decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *key_local;
  agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *this_local;
  
  dur_local = (duration *)key;
  key_local = (decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
               *)this;
  lock._M_device = (mutex_type *)std::chrono::_V2::system_clock::now();
  std::lock_guard<ranger::bhvr_tree::dummy_mutex>::lock_guard
            ((lock_guard<ranger::bhvr_tree::dummy_mutex> *)&it,(mutex_type *)&this->field_0x68);
  pVar3 = std::
          map<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::less<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*>,std::allocator<std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
          ::
          emplace<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*&,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>&>
                    ((map<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::less<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*>,std::allocator<std::pair<ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>const*const,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>>>>
                      *)&this->m_time_points,
                     (decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                      **)&dur_local,
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)&lock);
  local_70 = (_Base_ptr)pVar3.first._M_node;
  local_68 = pVar3.second;
  local_50 = local_70;
  local_48 = local_68;
  local_40._M_node = local_70;
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*const,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
           ::operator->(&local_40);
  local_78.__r = (rep)std::chrono::operator-
                                ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                  *)&lock,&ppVar2->second);
  bVar1 = std::chrono::operator<(&local_78,dur);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_ranger::bhvr_tree::decorator_timer_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>_*const,_std::chrono::time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>_>
             ::operator->(&local_40);
    (ppVar2->second).__d.__r = (rep)lock._M_device;
  }
  this_local._7_1_ = !bVar1;
  std::lock_guard<ranger::bhvr_tree::dummy_mutex>::~lock_guard
            ((lock_guard<ranger::bhvr_tree::dummy_mutex> *)&it);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool expired_then_update(const decorator_timer_node<AgentProxy>* key,
                           const typename Clock::duration& dur) {
    auto now = Clock::now();
    {
      std::lock_guard<Mutex> lock(m_time_points_mtx);

      auto it = m_time_points.emplace(key, now).first;
      if (now - it->second < dur) {
        return false;
      }

      it->second = now;
      return true;
    }
  }